

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O1

void __thiscall DFraggleThinker::Destroy(DFraggleThinker *this)

{
  DRunningScript *pDVar1;
  DRunningScript *pDVar2;
  
  pDVar1 = (this->RunningScripts).field_0.p;
  if ((pDVar1 != (DRunningScript *)0x0) && (((pDVar1->super_DObject).ObjectFlags & 0x20) != 0)) {
    (this->RunningScripts).field_0.p = (DRunningScript *)0x0;
    pDVar1 = (DRunningScript *)0x0;
  }
  while (pDVar1 != (DRunningScript *)0x0) {
    pDVar2 = (pDVar1->next).field_0.p;
    if ((pDVar2 != (DRunningScript *)0x0) && (((pDVar2->super_DObject).ObjectFlags & 0x20) != 0)) {
      (pDVar1->next).field_0.p = (DRunningScript *)0x0;
      pDVar2 = (DRunningScript *)0x0;
    }
    (pDVar1->prev).field_0.p = (DRunningScript *)0x0;
    (pDVar1->next).field_0.p = (DRunningScript *)0x0;
    (*(pDVar1->super_DObject)._vptr_DObject[4])();
    pDVar1 = pDVar2;
  }
  (this->RunningScripts).field_0.p = (DRunningScript *)0x0;
  (*(((this->LevelScript).field_0.p)->super_DObject)._vptr_DObject[4])();
  (this->LevelScript).field_0.p = (DFsScript *)0x0;
  if ((this->SpawnedThings).Count != 0) {
    (this->SpawnedThings).Count = 0;
  }
  ActiveThinker.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFraggleThinker>_1)0x0;
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DFraggleThinker::Destroy()
{
	DRunningScript *p = RunningScripts;
	while (p)
	{
		DRunningScript *q = p;
		p = p->next;
		q->prev = q->next = NULL;
		q->Destroy();
	}
	RunningScripts = NULL;

	LevelScript->Destroy();
	LevelScript = NULL;

	SpawnedThings.Clear();
	ActiveThinker = NULL;
	Super::Destroy();
}